

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooled_alloc.c
# Opt level: O3

pool_alloc_t * pool_create(size_t dsize)

{
  pool_alloc_t *ppVar1;
  size_t sVar2;
  
  ppVar1 = (pool_alloc_t *)malloc(0x20);
  if (ppVar1 != (pool_alloc_t *)0x0) {
    sVar2 = 8;
    if (7 < dsize + 7) {
      sVar2 = dsize + 7 & 0xfffffffffffffff8;
    }
    ppVar1->dsize = sVar2;
    ppVar1->npools = 0;
    ppVar1->pools = (pool_t *)0x0;
    ppVar1->free = (void *)0x0;
  }
  return ppVar1;
}

Assistant:

pool_alloc_t *pool_create(size_t dsize) {
    pool_alloc_t *p;

    if (NULL == (p = (pool_alloc_t *)malloc(sizeof(*p))))
	return NULL;

    /* Minimum size is a pointer, for free list */
    dsize = (dsize + sizeof(void *) - 1) & ~(sizeof(void *)-1);
    if (dsize < sizeof(void *))
	dsize = sizeof(void *);
    p->dsize = dsize;

    p->npools = 0;
    p->pools = NULL;
    p->free  = NULL;

    return p;
}